

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.cpp
# Opt level: O2

void __thiscall
SplitSVTest_single_word_surround_delim_Test<wchar_t>::SplitSVTest_single_word_surround_delim_Test
          (SplitSVTest_single_word_surround_delim_Test<wchar_t> *this)

{
  SplitSVTest<wchar_t>::SplitSVTest(&this->super_SplitSVTest<wchar_t>);
  *(undefined ***)&this->super_SplitSVTest<wchar_t> = &PTR__Test_004ac360;
  return;
}

Assistant:

TYPED_TEST(SplitSVTest, single_word_surround_delim) {
	std::basic_string<TypeParam> word;
	word += default_delim<TypeParam>;
	word += make_word<TypeParam>();
	word += default_delim<TypeParam>;
	std::basic_string_view<TypeParam> single_word = word;
	std::vector<std::basic_string<TypeParam>> split_result = split(single_word, default_delim<TypeParam>);
	EXPECT_EQ(split_result.size(), 3);
	EXPECT_EQ(split_result[0].size(), 0);
	EXPECT_EQ(split_result[1].size(), 8);
	EXPECT_EQ(split_result[2].size(), 0);
}